

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcbormap.cpp
# Opt level: O3

QCborValueRef __thiscall QCborMap::operator[](QCborMap *this,QString *key)

{
  storage_type_conflict *in_RCX;
  QCborValueConstRef QVar1;
  QStringView key_00;
  
  key_00.m_data = in_RCX;
  key_00.m_size = (qsizetype)(key->d).ptr;
  QVar1 = (QCborValueConstRef)
          QCborContainerPrivate::findOrAddMapKey<QStringView>
                    ((this->d).d.ptr,(QCborContainerPrivate *)(key->d).size,key_00);
  QExplicitlySharedDataPointer<QCborContainerPrivate>::reset(&this->d,QVar1.d);
  return (QCborValueRef)QVar1;
}

Assistant:

QCborValueRef QCborMap::operator[](const QString & key)
{
    return QCborContainerPrivate::findOrAddMapKey(*this, qToStringViewIgnoringNull(key));
}